

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_instance.c
# Opt level: O0

apx_error_t create_provide_port_data_file_info(apx_nodeInstance_t *self,rmf_fileInfo_t *file_info)

{
  apx_error_t aVar1;
  char local_118 [8];
  char file_name [256];
  rmf_fileInfo_t *file_info_local;
  apx_nodeInstance_t *self_local;
  
  file_name._248_8_ = file_info;
  if (((self != (apx_nodeInstance_t *)0x0) && (file_info != (rmf_fileInfo_t *)0x0)) &&
     (self->provide_port_init_data_size != 0)) {
    strcpy(local_118,self->name);
    strcat(local_118,".out");
    aVar1 = rmf_fileInfo_create((rmf_fileInfo_t *)file_name._248_8_,0x7fffffff,
                                self->provide_port_init_data_size,local_118,'\0','\0',(uint8_t *)0x0
                               );
    return aVar1;
  }
  __assert_fail("(self != NULL) && (file_info != NULL) && (self->provide_port_init_data_size > 0u)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/node_instance.c"
                ,0x479,
                "apx_error_t create_provide_port_data_file_info(apx_nodeInstance_t *, rmf_fileInfo_t *)"
               );
}

Assistant:

static apx_error_t create_provide_port_data_file_info(apx_nodeInstance_t* self, rmf_fileInfo_t* file_info)
{
   assert((self != NULL) && (file_info != NULL) && (self->provide_port_init_data_size > 0u));
   char file_name[RMF_MAX_FILE_NAME_SIZE + 1];
   strcpy(file_name, self->name);
   strcat(file_name, APX_PROVIDE_PORT_DATA_EXT);
   return rmf_fileInfo_create(file_info, RMF_INVALID_ADDRESS, self->provide_port_init_data_size, file_name,
      RMF_FILE_TYPE_FIXED, RMF_DIGEST_TYPE_NONE, NULL);
}